

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::GridLocalPolynomial::getSubGraph<(TasGrid::RuleLocal::erule)0>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GridLocalPolynomial *this,
          vector<int,_std::allocator<int>_> *point)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  reference rVar5;
  int slot;
  vector<int,_std::allocator<int>_> *local_b8;
  int local_ac;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> p;
  vector<bool,_std::allocator<bool>_> used;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = __return_storage_ptr__;
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&p,(vector<int,_std::allocator<int>_> *)point);
  monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0;
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&used,
             (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes,(bool *)&monkey_count,
             (allocator_type *)&monkey_tail);
  iVar4 = (this->super_BaseCanonicalGrid).num_dimensions;
  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)((ulong)monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_ << 0x20);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&monkey_count,1,
             (value_type_conflict3 *)&monkey_tail,(allocator_type *)&slot);
  iVar4 = iVar4 * 4;
  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  do {
    while( true ) {
      while( true ) {
        if (iVar4 <= *(int *)CONCAT71(monkey_count.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._1_7_,
                                      monkey_count.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_1_)) {
          ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&monkey_tail);
          ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&monkey_count);
          ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    ((_Bvector_base<std::allocator<bool>_> *)&used);
          ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&p);
          return local_b8;
        }
        if (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] < iVar4) break;
        piVar1 = monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-2] / 4] = *piVar1;
        monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish[-2] =
             monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish[-2] + 1;
        monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
      iVar2 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1] / 4;
      ::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&monkey_tail,
                 p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + iVar2);
      iVar3 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)0>
                        ((RuleLocal *)
                         (ulong)(uint)monkey_tail.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish[-1],
                         monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1] % 4,
                         monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1] % 4);
      p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = iVar3;
      slot = MultiIndexSet::getSlot
                       (&(this->super_BaseCanonicalGrid).points,
                        p.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      if (slot != -1) break;
LAB_0019c3c6:
      piVar1 = monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      p.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [iVar2] = *piVar1;
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] =
           monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] + 1;
    }
    rVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&used,(long)slot);
    if ((*rVar5._M_p & rVar5._M_mask) != 0) goto LAB_0019c3c6;
    ::std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_b8,&slot);
    rVar5 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&used,(long)slot);
    *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
    local_ac = 0;
    ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&monkey_count,&local_ac);
  } while( true );
}

Assistant:

std::vector<int> GridLocalPolynomial::getSubGraph(std::vector<int> const &point) const{
    std::vector<int> graph, p = point;
    std::vector<bool> used(points.getNumIndexes(), false);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    int max_kids = max_1d_kids * num_dimensions;

    std::vector<int> monkey_count(1, 0), monkey_tail;

    while(monkey_count[0] < max_kids){
        if (monkey_count.back() < max_kids){
            int dim = monkey_count.back() / max_1d_kids;
            monkey_tail.push_back(p[dim]);
            p[dim] = RuleLocal::getKid<effrule>(monkey_tail.back(), monkey_count.back() % max_1d_kids);
            int slot = points.getSlot(p);
            if ((slot == -1) || used[slot]){ // this kid is missing
                p[dim] = monkey_tail.back();
                monkey_tail.pop_back();
                monkey_count.back()++;
            }else{ // found kid, go deeper in the graph
                graph.push_back(slot);
                used[slot] = true;
                monkey_count.push_back(0);
            }
        }else{
            monkey_count.pop_back();
            int dim = monkey_count.back() / max_1d_kids;
            p[dim] = monkey_tail.back();
            monkey_tail.pop_back();
            monkey_count.back()++;
        }
    }

    return graph;
}